

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shifts.c
# Opt level: O1

uint32_t arm_shift_special_zero_behavior
                   (arm7tdmi_t *state,status_register_t *cpsr,shift_type_t type,uint32_t data)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t extraout_EAX;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  int extraout_EDX;
  int extraout_EDX_00;
  status_register_t *psVar3;
  arm7tdmi_t *state_00;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar4;
  undefined8 uVar5;
  
  psVar3 = cpsr;
  if (2 < gba_log_verbosity) {
    puts("[DEBUG] ----handling special case, immediate shift amount 0----");
  }
  switch(type) {
  case LSL:
    return data;
  case LSR:
    if (2 < gba_log_verbosity) {
      puts("[DEBUG] LSR shift");
    }
    uVar1 = 0;
    break;
  case ASR:
    uVar1 = (int)data >> 0x1f;
    break;
  case ROR:
    uVar2 = (state->cpsr).raw;
    if (cpsr != (status_register_t *)0x0) {
      cpsr->raw = cpsr->raw & 0xdfffffff | (data & 1) << 0x1d;
    }
    return (data >> 1) + (uVar2 & 0xe0000000) * 4;
  default:
    state_00 = (arm7tdmi_t *)(ulong)type;
    arm_shift_special_zero_behavior_cold_1();
    if ((int)psVar3 <= extraout_EDX) {
      uVar2 = 1 << ((char)psVar3 - 1U & 0x1f) & (uint)state_00;
      return ((uint)state_00 ^ uVar2) - uVar2;
    }
    uVar5 = extraout_RAX;
    sign_extend_64_cold_1();
    if ((int)psVar3 <= extraout_EDX_00) {
      uVar2 = 1 << ((char)psVar3 - 1U & 0x1f) & (uint)state_00;
      return ((uint)state_00 ^ uVar2) - uVar2;
    }
    uVar4 = extraout_RAX_00;
    sign_extend_word_cold_1();
    if (gba_log_verbosity != 0) {
      printf("\x1b[0;33m[WARN]  adjusted pc: 0x%08X: SWI: 0x%X - %s\n\x1b[0;m",
             (ulong)((state_00->pc + (((state_00->cpsr).raw & 0x20) >> 3)) - 8),(ulong)psVar3 & 0xff
             ,SWI_NAMES_rel + *(int *)(SWI_NAMES_rel + ((ulong)psVar3 & 0xff) * 4),in_R8,in_R9,
             (ulong)data,uVar4,uVar5);
    }
    uVar2 = (state_00->cpsr).raw;
    (state_00->cpsr).raw = uVar2 & 0xffffffe0 | 0x13;
    set_spsr(state_00,uVar2);
    state_00->lr_svc = (state_00->pc + (((state_00->cpsr).raw & 0x20) >> 4)) - 4;
    (state_00->cpsr).raw = (state_00->cpsr).raw & 0xffffff5f | 0x80;
    set_pc(state_00,8);
    return extraout_EAX;
  }
  if (cpsr != (status_register_t *)0x0) {
    cpsr->raw = cpsr->raw & 0xdfffffff | data >> 2 & 0x20000000;
  }
  return uVar1;
}

Assistant:

word arm_shift_special_zero_behavior(arm7tdmi_t* state, status_register_t* cpsr, shift_type_t type, word data) {
    logdebug("----handling special case, immediate shift amount 0----")
    switch (type) {
        case LSL:
            return data; // Not affected.
        case LSR:
            // Treat it as LSR#32
            return arm_shift(cpsr, LSR, data, 32);
        case ASR:
            // Treat it as ASR#32
            return arm_shift(cpsr, ASR, data, 32);
        case ROR: {
            word oldc = state->cpsr.C;
            if (cpsr) {
                cpsr->C = data & 1u;
            }
            return (oldc << 31u) | (data >> 1u);
        }
        default:
            logfatal("Unknown shift type: %d (this should never happen)", type)
    }
}